

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O3

int json_emit_va(char *s,int s_len,char *fmt,__va_list_tag *ap)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  undefined8 *puVar4;
  ulong *puVar5;
  int *piVar6;
  size_t sVar7;
  ulong uVar8;
  uint uVar9;
  size_t __n;
  char *pcVar10;
  void *__src;
  long lVar11;
  uint uVar12;
  byte *pbVar13;
  int iVar14;
  byte *s_00;
  char tmp [20];
  int local_58;
  char local_48 [24];
  
  pbVar13 = (byte *)(s + s_len);
  s_00 = (byte *)s;
  do {
    bVar1 = *fmt;
    iVar14 = (int)s_00;
    iVar2 = (int)pbVar13;
    if (bVar1 < 0x53) {
      uVar9 = bVar1 - 9;
      if (uVar9 < 0x3e) {
        if ((0x2000800800013U >> ((ulong)uVar9 & 0x3f) & 1) != 0) goto switchD_00106cba_caseD_5b;
        if ((ulong)uVar9 != 0x3d) goto LAB_00106d07;
        uVar9 = iVar2 - iVar14;
        lVar11 = 5;
        if (0 < (int)uVar9) {
          sVar7 = 5;
          if (uVar9 < 5) {
            sVar7 = (size_t)uVar9;
          }
          memcpy(s_00,"false",sVar7);
          if (5 < uVar9) goto LAB_00106da9;
        }
      }
      else {
LAB_00106d07:
        if (bVar1 != 0x4e) {
          if (bVar1 == 0) {
            if (s_00 < pbVar13) {
              *s_00 = 0;
            }
            local_58 = (int)s;
            return iVar14 - local_58;
          }
LAB_00106fdd:
          return 0;
        }
        uVar9 = iVar2 - iVar14;
        lVar11 = 4;
        if (0 < (int)uVar9) {
          sVar7 = 4;
          if (uVar9 < 4) {
            sVar7 = (size_t)uVar9;
          }
          pcVar10 = "null";
LAB_00106d98:
          lVar11 = 4;
          memcpy(s_00,pcVar10,sVar7);
          if (4 < uVar9) {
LAB_00106da9:
            s_00[sVar7] = 0;
          }
        }
      }
      goto LAB_00106fbb;
    }
    if (bVar1 < 0x66) {
      switch(bVar1) {
      case 0x53:
        uVar9 = ap->gp_offset;
        if ((ulong)uVar9 < 0x29) {
          puVar4 = (undefined8 *)((ulong)uVar9 + (long)ap->reg_save_area);
          ap->gp_offset = uVar9 + 8;
        }
        else {
          puVar4 = (undefined8 *)ap->overflow_arg_area;
          ap->overflow_arg_area = puVar4 + 1;
        }
        pcVar10 = (char *)*puVar4;
        uVar12 = iVar2 - iVar14;
        sVar7 = strlen(pcVar10);
        uVar9 = (uint)sVar7;
        if ((0 < (int)uVar12) && (0 < (int)uVar9)) {
          __n = (size_t)uVar12;
          if (uVar9 < uVar12) {
            __n = sVar7 & 0xffffffff;
          }
          memcpy(s_00,pcVar10,__n);
          if (uVar9 < uVar12) {
            s_00[__n] = 0;
          }
        }
        lVar11 = (long)(int)uVar9;
        break;
      case 0x54:
        uVar9 = iVar2 - iVar14;
        lVar11 = 4;
        if (0 < (int)uVar9) {
          sVar7 = 4;
          if (uVar9 < 4) {
            sVar7 = (size_t)uVar9;
          }
          pcVar10 = "true";
          goto LAB_00106d98;
        }
        break;
      default:
        goto LAB_00106fdd;
      case 0x56:
        uVar9 = ap->gp_offset;
        uVar8 = (ulong)uVar9;
        if (uVar8 < 0x29) {
          ap->gp_offset = (uint)(uVar8 + 8);
          __src = *(void **)((long)ap->reg_save_area + uVar8);
          if (0x20 < uVar9) goto LAB_00106e35;
          puVar5 = (ulong *)(uVar8 + 8 + (long)ap->reg_save_area);
          ap->gp_offset = uVar9 + 0x10;
        }
        else {
          puVar4 = (undefined8 *)ap->overflow_arg_area;
          ap->overflow_arg_area = puVar4 + 1;
          __src = (void *)*puVar4;
LAB_00106e35:
          puVar5 = (ulong *)ap->overflow_arg_area;
          ap->overflow_arg_area = puVar5 + 1;
        }
        uVar9 = iVar2 - iVar14;
        uVar12 = (uint)*puVar5;
        if ((0 < (int)uVar9) && (0 < (int)uVar12)) {
          sVar7 = (size_t)uVar9;
          if (uVar12 < uVar9) {
            sVar7 = *puVar5 & 0xffffffff;
          }
          memcpy(s_00,__src,sVar7);
          if (uVar12 < uVar9) {
            s_00[sVar7] = 0;
          }
        }
        lVar11 = (long)(int)uVar12;
        break;
      case 0x5b:
      case 0x5d:
switchD_00106cba_caseD_5b:
        lVar11 = 1;
        if (s_00 < pbVar13) {
          *s_00 = bVar1;
        }
      }
    }
    else {
      if (bVar1 < 0x76) {
        if (bVar1 == 0x66) {
          uVar9 = ap->fp_offset;
          if ((ulong)uVar9 < 0xa1) {
            puVar4 = (undefined8 *)((ulong)uVar9 + (long)ap->reg_save_area);
            ap->fp_offset = uVar9 + 0x10;
          }
          else {
            puVar4 = (undefined8 *)ap->overflow_arg_area;
            ap->overflow_arg_area = puVar4 + 1;
          }
          iVar3 = snprintf(local_48,0x14,"%g",*puVar4);
        }
        else {
          if (bVar1 != 0x69) {
            if (bVar1 != 0x73) {
              return 0;
            }
            uVar9 = ap->gp_offset;
            if ((ulong)uVar9 < 0x29) {
              puVar4 = (undefined8 *)((ulong)uVar9 + (long)ap->reg_save_area);
              ap->gp_offset = uVar9 + 8;
            }
            else {
              puVar4 = (undefined8 *)ap->overflow_arg_area;
              ap->overflow_arg_area = puVar4 + 1;
            }
            pcVar10 = (char *)*puVar4;
            sVar7 = strlen(pcVar10);
            iVar2 = json_emit_quoted_str((char *)s_00,iVar2 - iVar14,pcVar10,(int)sVar7);
            lVar11 = (long)iVar2;
            goto LAB_00106fbb;
          }
          uVar9 = ap->gp_offset;
          if ((ulong)uVar9 < 0x29) {
            puVar4 = (undefined8 *)((ulong)uVar9 + (long)ap->reg_save_area);
            ap->gp_offset = uVar9 + 8;
          }
          else {
            puVar4 = (undefined8 *)ap->overflow_arg_area;
            ap->overflow_arg_area = puVar4 + 1;
          }
          iVar3 = snprintf(local_48,0x14,"%ld",*puVar4);
        }
        uVar9 = iVar2 - iVar14;
        if (iVar2 - iVar14 < 1) {
          uVar9 = 0;
        }
        strncpy((char *)s_00,local_48,(ulong)uVar9);
        lVar11 = (long)iVar3;
        goto LAB_00106fbb;
      }
      if (bVar1 != 0x76) {
        if ((bVar1 != 0x7d) && (bVar1 != 0x7b)) {
          return 0;
        }
        goto switchD_00106cba_caseD_5b;
      }
      uVar9 = ap->gp_offset;
      uVar8 = (ulong)uVar9;
      if (uVar8 < 0x29) {
        ap->gp_offset = (uint)(uVar8 + 8);
        pcVar10 = *(char **)((long)ap->reg_save_area + uVar8);
        if (0x20 < uVar9) goto LAB_00106f14;
        piVar6 = (int *)(uVar8 + 8 + (long)ap->reg_save_area);
        ap->gp_offset = uVar9 + 0x10;
      }
      else {
        puVar4 = (undefined8 *)ap->overflow_arg_area;
        ap->overflow_arg_area = puVar4 + 1;
        pcVar10 = (char *)*puVar4;
LAB_00106f14:
        piVar6 = (int *)ap->overflow_arg_area;
        ap->overflow_arg_area = piVar6 + 2;
      }
      iVar2 = json_emit_quoted_str((char *)s_00,iVar2 - iVar14,pcVar10,*piVar6);
      lVar11 = (long)iVar2;
    }
LAB_00106fbb:
    s_00 = s_00 + lVar11;
    fmt = (char *)((byte *)fmt + 1);
  } while( true );
}

Assistant:

int json_emit_va(char *s, int s_len, const char *fmt, va_list ap) {
    const char *end = s + s_len, *str, *orig = s;
    size_t len;

    while (*fmt != '\0') {
        switch (*fmt) {
            case '[':
            case ']':
            case '{':
            case '}':
            case ',':
            case ':':
            case ' ':
            case '\r':
            case '\n':
            case '\t':
                if (s < end) {
                    *s = *fmt;
                }
                s++;
                break;
            case 'i':
                s += json_emit_long(s, end - s, va_arg(ap, long));
                break;
            case 'f':
                s += json_emit_double(s, end - s, va_arg(ap, double));
                break;
            case 'v':
                str = va_arg(ap, char *);
                len = va_arg(ap, size_t);
                s += json_emit_quoted_str(s, end - s, str, len);
                break;
            case 'V':
                str = va_arg(ap, char *);
                len = va_arg(ap, size_t);
                s += json_emit_unquoted_str(s, end - s, str, len);
                break;
            case 's':
                str = va_arg(ap, char *);
                s += json_emit_quoted_str(s, end - s, str, strlen(str));
                break;
            case 'S':
                str = va_arg(ap, char *);
                s += json_emit_unquoted_str(s, end - s, str, strlen(str));
                break;
            case 'T':
                s += json_emit_unquoted_str(s, end - s, "true", 4);
                break;
            case 'F':
                s += json_emit_unquoted_str(s, end - s, "false", 5);
                break;
            case 'N':
                s += json_emit_unquoted_str(s, end - s, "null", 4);
                break;
            default:
                return 0;
        }
        fmt++;
    }

    /* Best-effort to 0-terminate generated string */
    if (s < end) {
        *s = '\0';
    }

    return s - orig;
}